

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_input_init_alloc
              (uchar *txhash,size_t txhash_len,uint32_t utxo_index,uint32_t sequence,uchar *script,
              size_t script_len,wally_tx_witness_stack *witness,wally_tx_input **output)

{
  wally_tx_input *pwVar1;
  int ret;
  wally_tx_input *result;
  size_t script_len_local;
  uchar *script_local;
  uint32_t sequence_local;
  uint32_t utxo_index_local;
  size_t txhash_len_local;
  uchar *txhash_local;
  
  if (output == (wally_tx_input **)0x0) {
    txhash_local._4_4_ = -2;
  }
  else {
    *output = (wally_tx_input *)0x0;
    pwVar1 = (wally_tx_input *)wally_calloc(0xd0);
    *output = pwVar1;
    if (*output == (wally_tx_input *)0x0) {
      txhash_local._4_4_ = -3;
    }
    else {
      pwVar1 = *output;
      txhash_local._4_4_ =
           wally_tx_input_init(txhash,txhash_len,utxo_index,sequence,script,script_len,witness,
                               pwVar1);
      if (txhash_local._4_4_ != 0) {
        clear_and_free(pwVar1,0xd0);
        *output = (wally_tx_input *)0x0;
      }
    }
  }
  return txhash_local._4_4_;
}

Assistant:

int wally_tx_input_init_alloc(const unsigned char *txhash, size_t txhash_len,
                              uint32_t utxo_index, uint32_t sequence,
                              const unsigned char *script, size_t script_len,
                              const struct wally_tx_witness_stack *witness,
                              struct wally_tx_input **output)
{
    struct wally_tx_input *result;
    int ret;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_tx_input);

    ret = wally_tx_input_init(txhash, txhash_len, utxo_index, sequence,
                              script, script_len, witness, result);

    if (ret != WALLY_OK) {
        clear_and_free(result, sizeof(*result));
        *output = NULL;
    }
    return ret;
}